

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac_oggbs__goto_next_page
                    (ma_dr_flac_oggbs *oggbs,ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  int in_ESI;
  long in_RDI;
  ma_uint32 actualCRC32;
  ma_uint32 pageBodySize;
  ma_uint32 bytesRead;
  ma_uint32 crc32;
  ma_dr_flac_ogg_page_header header;
  int i;
  ma_uint32 pageBodySize_1;
  ma_uint32 i_1;
  uint in_stack_fffffffffffffe90;
  ma_dr_flac_oggbs *in_stack_fffffffffffffe98;
  ma_dr_flac_oggbs *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  ma_dr_flac_ogg_crc_mismatch_recovery in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int local_30;
  ma_dr_flac_seek_origin local_2c;
  uint local_20;
  uint local_c;
  
  while( true ) {
    while( true ) {
      do {
        local_c = 0;
        mVar1 = ma_dr_flac_ogg__read_page_header
                          ((ma_dr_flac_read_proc)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (ma_dr_flac_ogg_page_header *)in_stack_fffffffffffffea0,
                           (ma_uint32 *)in_stack_fffffffffffffe98,
                           (ma_uint32 *)(ulong)in_stack_fffffffffffffe90);
        if (mVar1 != MA_SUCCESS) {
          return 0;
        }
        *(ulong *)(in_RDI + 0x18) = (ulong)in_stack_fffffffffffffe90 + *(long *)(in_RDI + 0x18);
        local_2c = ma_dr_flac_seek_origin_start;
        for (local_30 = 0; local_30 < (int)(in_stack_fffffffffffffeb4 & 0xff);
            local_30 = local_30 + 1) {
          local_2c = (byte)(&stack0xfffffffffffffeb5)[local_30] + local_2c;
        }
      } while (0xff1b < local_2c);
      if (in_stack_fffffffffffffea8 == *(int *)(in_RDI + 0x28)) break;
      if ((local_2c != ma_dr_flac_seek_origin_start) &&
         (mVar2 = ma_dr_flac_oggbs__seek_physical
                            (in_stack_fffffffffffffe98,CONCAT44(local_c,in_stack_fffffffffffffe90),
                             local_2c), mVar2 == 0)) {
        return 0;
      }
    }
    sVar3 = ma_dr_flac_oggbs__read_physical
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(local_c,in_stack_fffffffffffffe90));
    if (sVar3 != local_2c) {
      return 0;
    }
    *(ma_dr_flac_seek_origin *)(in_RDI + 0x274) = local_2c;
    for (local_20 = 0; local_20 < *(uint *)(in_RDI + 0x274); local_20 = local_20 + 1) {
      local_c = local_c << 8 ^
                ma_dr_flac__crc32_table
                [(int)(local_c >> 0x18 ^ (uint)*(byte *)(in_RDI + 0x278 + (ulong)local_20))];
    }
    if (local_c == in_stack_fffffffffffffeb0) break;
    if (in_ESI != 0) {
      ma_dr_flac_oggbs__goto_next_page
                ((ma_dr_flac_oggbs *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb4);
      return 0;
    }
    in_ESI = 0;
  }
  memcpy((void *)(in_RDI + 0x150),&stack0xfffffffffffffe98,0x120);
  *(ma_dr_flac_seek_origin *)(in_RDI + 0x270) = local_2c;
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__goto_next_page(ma_dr_flac_oggbs* oggbs, ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)
{
    ma_dr_flac_ogg_page_header header;
    for (;;) {
        ma_uint32 crc32 = 0;
        ma_uint32 bytesRead;
        ma_uint32 pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        ma_uint32 actualCRC32;
#endif
        if (ma_dr_flac_ogg__read_page_header(oggbs->onRead, oggbs->pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += bytesRead;
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize > MA_DR_FLAC_OGG_MAX_PAGE_SIZE) {
            continue;
        }
        if (header.serialNumber != oggbs->serialNumber) {
            if (pageBodySize > 0 && !ma_dr_flac_oggbs__seek_physical(oggbs, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            continue;
        }
        if (ma_dr_flac_oggbs__read_physical(oggbs, oggbs->pageData, pageBodySize) != pageBodySize) {
            return MA_FALSE;
        }
        oggbs->pageDataSize = pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        actualCRC32 = ma_dr_flac_crc32_buffer(crc32, oggbs->pageData, oggbs->pageDataSize);
        if (actualCRC32 != header.checksum) {
            if (recoveryMethod == ma_dr_flac_ogg_recover_on_crc_mismatch) {
                continue;
            } else {
                ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch);
                return MA_FALSE;
            }
        }
#else
        (void)recoveryMethod;
#endif
        oggbs->currentPageHeader = header;
        oggbs->bytesRemainingInPage = pageBodySize;
        return MA_TRUE;
    }
}